

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O2

Error * ot::commissioner::TokenManager::PrepareSigningContent
                  (Error *__return_storage_ptr__,ByteArray *aContent,Message *aMessage)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  Type aTlvType;
  ErrorCode EVar3;
  pointer __first;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  char *from;
  Error *pEVar8;
  size_t sVar9;
  _Base_ptr p_Var10;
  char *to;
  uint uVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  ByteArray content;
  undefined1 local_188 [8];
  char *local_180;
  size_t local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  parse_func local_160 [1];
  string signingUri;
  writer write;
  string local_130;
  TlvSet tlvSet;
  undefined1 local_e0 [40];
  Message message;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  coap::Message::Message
            (&message,*(byte *)&aMessage->mHeader >> 2 & kReset,(aMessage->mHeader).mCode);
  p_Var1 = &tlvSet._M_t._M_impl.super__Rb_tree_header;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  signingUri._M_dataplus._M_p = (pointer)&signingUri.field_2;
  signingUri._M_string_length = 0;
  signingUri.field_2._M_local_buf[0] = '\0';
  content.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  content.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  content.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  coap::Message::GetUriPath((Error *)local_188,aMessage,&signingUri);
  uVar4 = local_188._0_4_;
  std::__cxx11::string::~string((string *)&local_180);
  if (uVar4 == none_type) {
    bVar5 = std::operator==(&signingUri,"/c/as");
    bVar6 = std::operator==(&signingUri,"/c/ps");
    bVar7 = std::operator==(&signingUri,"/c/cp");
    if ((bVar7) || (bVar7 = std::operator==(&signingUri,"/c/ca"), bVar7)) {
      std::__cxx11::string::assign((char *)&signingUri);
    }
    coap::Message::SetUriPath((Error *)local_188,&message,&signingUri);
    pEVar8 = Error::operator=(__return_storage_ptr__,(Error *)local_188);
    EVar3 = pEVar8->mCode;
    std::__cxx11::string::~string((string *)&local_180);
    if (EVar3 == kNone) {
      coap::Message::Serialize((Error *)local_188,&message,&content);
      pEVar8 = Error::operator=(__return_storage_ptr__,(Error *)local_188);
      EVar3 = pEVar8->mCode;
      std::__cxx11::string::~string((string *)&local_180);
      __first = content.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (EVar3 == kNone) {
        sVar9 = coap::Message::GetHeaderLength(&message);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                  (&content,(const_iterator)__first,(const_iterator)(__first + sVar9));
        tlv::GetTlvSet((Error *)local_188,&tlvSet,&aMessage->mPayload,kMeshCoP);
        pEVar8 = Error::operator=(__return_storage_ptr__,(Error *)local_188);
        EVar3 = pEVar8->mCode;
        std::__cxx11::string::~string((string *)&local_180);
        if (EVar3 == kNone) {
          for (p_Var10 = tlvSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var10 != p_Var1;
              p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
            aTlvType = (Type)p_Var10[1]._M_color;
            if (bVar6) {
              if (aTlvType != 0x34) {
LAB_001bcd32:
                bVar7 = tlv::IsDatasetParameter(!bVar6,aTlvType);
                if (bVar7) goto LAB_001bcd3e;
              }
            }
            else {
              if (bVar5) goto LAB_001bcd32;
              uVar11 = aTlvType - 0x3f;
              if ((uVar11 < 8) && ((0x83U >> (uVar11 & 0x1f) & 1) != 0)) goto LAB_001bcd61;
LAB_001bcd3e:
              tlv::Tlv::Serialize((Tlv *)p_Var10[1]._M_parent,&content);
            }
LAB_001bcd61:
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    (aContent,&content);
        }
      }
    }
  }
  else {
    local_188._0_4_ = none_type;
    local_180 = "the CoAP message has no valid URI Path option";
    local_178 = 0x2d;
    local_170._M_allocated_capacity = 0;
    local_160[0] = (parse_func)0x0;
    from = "the CoAP message has no valid URI Path option";
    local_170._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_188;
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_188;
    while (from != "") {
      cVar2 = *from;
      to = from;
      while (cVar2 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,from,"");
          goto LAB_001bcb5c;
        }
        cVar2 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_188);
    }
LAB_001bcb5c:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_188;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_130,(v10 *)"the CoAP message has no valid URI Path option",
               (string_view)ZEXT816(0x2d),args);
    local_e0._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_e0 + 8),(string *)&local_130);
    Error::operator=(__return_storage_ptr__,(Error *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
    std::__cxx11::string::~string((string *)&local_130);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&content.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&signingUri);
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&tlvSet._M_t);
  coap::Message::~Message(&message);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::PrepareSigningContent(ByteArray &aContent, const coap::Message &aMessage)
{
    Error         error;
    coap::Message message{aMessage.GetType(), aMessage.GetCode()};
    tlv::TlvSet   tlvSet;
    std::string   signingUri;
    bool          isActiveSet  = false;
    bool          isPendingSet = false;
    ByteArray     content;

    VerifyOrExit(aMessage.GetUriPath(signingUri) == ErrorCode::kNone,
                 error = ERROR_INVALID_ARGS("the CoAP message has no valid URI Path option"));

    isActiveSet  = signingUri == uri::kMgmtActiveSet;
    isPendingSet = signingUri == uri::kMgmtPendingSet;

    if (signingUri == uri::kPetitioning)
    {
        signingUri = uri::kLeaderPetitioning;
    }
    else if (signingUri == uri::kKeepAlive)
    {
        signingUri = uri::kLeaderKeepAlive;
    }

    // Prepare serialized URI
    SuccessOrExit(error = message.SetUriPath(signingUri));
    SuccessOrExit(error = message.Serialize(content));
    content.erase(content.begin(), content.begin() + message.GetHeaderLength());

    // Sort and serialize TLVs
    SuccessOrExit(error = tlv::GetTlvSet(tlvSet, aMessage.GetPayload()));
    for (const auto &tlv : tlvSet)
    {
        if (ShouldBeSerialized(tlv.first, isActiveSet, isPendingSet))
        {
            tlv.second->Serialize(content);
        }
    }

    aContent = std::move(content);

exit:
    return error;
}